

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnOrder::printTo(ColumnOrder *this,ostream *out)

{
  string sStack_38;
  
  std::operator<<(out,"ColumnOrder(");
  std::operator<<(out,"TYPE_ORDER=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TypeDefinedOrder>(&sStack_38,&this->TYPE_ORDER)
    ;
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void ColumnOrder::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnOrder(";
  out << "TYPE_ORDER="; (__isset.TYPE_ORDER ? (out << to_string(TYPE_ORDER)) : (out << "<null>"));
  out << ")";
}